

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

Expression * __thiscall
soul::HEARTGenerator::evaluateAsExpression(HEARTGenerator *this,Expression *e)

{
  Category CVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  CastType CVar6;
  Constant *pCVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Expression *pEVar12;
  StructMemberRef *a;
  StructElement *pSVar13;
  ArrayElementRef *a_00;
  ArrayElement *pAVar14;
  TypeCast *this_00;
  size_t sVar15;
  undefined4 extraout_var_01;
  ArraySize AVar16;
  Variable *pVVar17;
  BinaryOperator *this_01;
  Expression *pEVar18;
  BinaryOperator *source;
  UnaryOperator *pUVar19;
  ProcessorProperty *pPVar20;
  Scope *p;
  Expression *pEVar21;
  Scope *p_1;
  Type *dest;
  pool_ptr<soul::AST::Constant> c;
  Type local_f0;
  CodeLocation local_d8;
  Type local_c8;
  CodeLocation local_b0;
  CompileMessage local_a0;
  CompileMessage local_68;
  Scope *pSVar11;
  
  uVar3 = this->expressionDepth + 1;
  this->expressionDepth = uVar3;
  if (uVar3 < this->maxExpressionDepth) {
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_f0,e);
    if (local_f0._0_8_ != 0) {
      pCVar7 = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                         (&this->module->allocator->pool,(CodeLocation *)(local_f0._0_8_ + 0x10),
                          (Value *)(local_f0._0_8_ + 0x30));
      return &pCVar7->super_Expression;
    }
    plVar8 = (long *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::VariableRef::typeinfo,0);
    if (plVar8 != (long *)0x0) {
      bVar2 = AST::VariableDeclaration::isAssignable((VariableDeclaration *)plVar8[6]);
      if (bVar2) {
        plVar10 = *(long **)(plVar8[6] + 0x20);
        do {
          lVar9 = (**(code **)(*plVar10 + 0x28))(plVar10);
          if (lVar9 != 0) break;
          plVar10 = (long *)(**(code **)(*plVar10 + 0x20))(plVar10);
        } while (plVar10 != (long *)0x0);
        pSVar11 = (e->super_Statement).super_ASTObject.context.parentScope;
        do {
          iVar4 = (*pSVar11->_vptr_Scope[5])(pSVar11);
          if (CONCAT44(extraout_var,iVar4) != 0) break;
          iVar5 = (*pSVar11->_vptr_Scope[4])(pSVar11);
          pSVar11 = (Scope *)CONCAT44(extraout_var_00,iVar5);
        } while (pSVar11 != (Scope *)0x0);
        if (lVar9 != CONCAT44(extraout_var,iVar4)) {
          CompileMessageHelpers::createMessage<>
                    (&local_68,syntax,error,
                     "Cannot reference a mutable variable belonging to another processor");
          AST::Context::throwError((Context *)(plVar8 + 2),&local_68,false);
        }
      }
      pEVar12 = *(Expression **)(plVar8[6] + 0x70);
      if (pEVar12 != (Expression *)0x0) {
        return pEVar12;
      }
      pEVar21 = *(Expression **)(plVar8[6] + 0x38);
      if (pEVar21 != (Expression *)0x0) {
        pEVar12 = evaluateAsExpression(this,pEVar21);
        return pEVar12;
      }
      (**(code **)(*plVar8 + 0x20))(&local_f0,plVar8);
      pCVar7 = heart::Allocator::allocateZeroInitialiser
                         (((this->builder).super_BlockBuilder.module)->allocator,&local_f0);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
      return &pCVar7->super_Expression;
    }
    a = (StructMemberRef *)
        __dynamic_cast(e,&AST::Expression::typeinfo,&AST::StructMemberRef::typeinfo,0);
    if (a != (StructMemberRef *)0x0) {
      getStructType(&local_f0,this,a);
      pEVar12 = evaluateAsExpression(this,(a->object).object,&local_f0);
      pSVar13 = createStructSubElement(this,a,pEVar12);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
      return &pSVar13->super_Expression;
    }
    a_00 = (ArrayElementRef *)
           __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
    if (a_00 != (ArrayElementRef *)0x0) {
      getArrayOrVectorType(&local_f0,this,a_00);
      pEVar21 = (a_00->object).object;
      if (pEVar21 != (Expression *)0x0) {
        pEVar12 = evaluateAsExpression(this,pEVar21,&local_f0);
        pAVar14 = createArraySubElement(this,a_00,pEVar12);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
        return &pAVar14->super_Expression;
      }
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    this_00 = (TypeCast *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::TypeCast::typeinfo,0);
    if (this_00 != (TypeCast *)0x0) {
      sVar15 = AST::TypeCast::getNumArguments(this_00);
      if (sVar15 == 0) {
        throwInternalCompilerError("c->getNumArguments() != 0","evaluateAsExpression",0x26b);
      }
      pEVar21 = (this_00->source).object;
      lVar9 = __dynamic_cast(pEVar21,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0
                            );
      if (lVar9 != 0) {
        if (*(long *)(lVar9 + 0x38) != 1) goto LAB_0021edb2;
        pEVar21 = (Expression *)**(undefined8 **)(lVar9 + 0x30);
      }
      pEVar12 = evaluateAsExpression(this,pEVar21);
      iVar4 = (*(pEVar12->super_Object)._vptr_Object[2])(pEVar12);
      dest = &this_00->targetType;
      CVar6 = TypeRules::getCastType(dest,(Type *)CONCAT44(extraout_var_01,iVar4));
      if (CVar6 != notPossible) {
        pEVar12 = BlockBuilder::createCastIfNeeded
                            ((this->builder).super_BlockBuilder.module,pEVar12,dest);
        return pEVar12;
      }
      CVar1 = (this_00->targetType).category;
      if ((((CVar1 & ~wrap) == vector) ||
          (CVar1 == array && (this_00->targetType).boundingSize != 0)) &&
         (AVar16 = Type::getNumAggregateElements(dest), AVar16 == 1)) {
LAB_0021edb2:
        pVVar17 = createAggregateWithInitialisers(this,this_00);
        return &pVVar17->super_Expression;
      }
      SanityCheckPass::expectCastPossible
                (&(((this_00->source).object)->super_Statement).super_ASTObject.context,dest,
                 (Type *)CONCAT44(extraout_var_01,iVar4));
    }
    this_01 = (BinaryOperator *)
              __dynamic_cast(e,&AST::Expression::typeinfo,&AST::BinaryOperator::typeinfo,0);
    if (this_01 != (BinaryOperator *)0x0) {
      AST::BinaryOperator::resolveOpTypes(this_01);
      local_f0.category = (this_01->resolvedOpTypes).operandType.category;
      local_f0.arrayElementCategory = (this_01->resolvedOpTypes).operandType.arrayElementCategory;
      local_f0.isRef = (this_01->resolvedOpTypes).operandType.isRef;
      local_f0.isConstant = (this_01->resolvedOpTypes).operandType.isConstant;
      local_f0.primitiveType.type = (this_01->resolvedOpTypes).operandType.primitiveType.type;
      local_f0.boundingSize = (this_01->resolvedOpTypes).operandType.boundingSize;
      local_f0.arrayElementBoundingSize =
           (this_01->resolvedOpTypes).operandType.arrayElementBoundingSize;
      local_f0.structure.object = (this_01->resolvedOpTypes).operandType.structure.object;
      if (local_f0.structure.object != (Structure *)0x0) {
        ((local_f0.structure.object)->super_RefCountedObject).refCount =
             ((local_f0.structure.object)->super_RefCountedObject).refCount + 1;
      }
      pEVar12 = evaluateAsExpression(this,(this_01->lhs).object);
      pEVar12 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,pEVar12,&local_f0);
      pEVar18 = evaluateAsExpression(this,(this_01->rhs).object);
      pEVar18 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,pEVar18,&local_f0);
      local_b0.sourceCode.object =
           (this_01->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.
           object;
      if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_b0.location.data =
           (this_01->super_Expression).super_Statement.super_ASTObject.context.location.location.
           data;
      local_c8._0_4_ = this_01->operation;
      source = PoolAllocator::
               allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                         (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_b0,
                          pEVar12,pEVar18,(Op *)&local_c8);
      (*(this_01->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                (&local_c8,this_01);
      pEVar12 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,&source->super_Expression,
                           &local_c8);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_c8.structure.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
      return pEVar12;
    }
    plVar8 = (long *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::UnaryOperator::typeinfo,0);
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 0x20))(&local_f0,plVar8);
      pEVar12 = evaluateAsExpression(this,(Expression *)plVar8[6]);
      pEVar12 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,pEVar12,&local_f0);
      local_d8.sourceCode.object = (SourceCodeText *)plVar8[2];
      if (local_d8.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_d8.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_d8.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_d8.location.data = (char *)plVar8[3];
      local_c8._0_4_ = *(undefined4 *)(plVar8 + 7);
      pUVar19 = PoolAllocator::
                allocate<soul::heart::UnaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::UnaryOp::Op&>
                          (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_d8,
                           pEVar12,(Op *)&local_c8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d8.sourceCode.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
      return &pUVar19->super_Expression;
    }
    lVar9 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ProcessorProperty::typeinfo,0);
    if (lVar9 != 0) {
      if (this->module->moduleType != namespaceModule) {
        pPVar20 = PoolAllocator::
                  allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                            (&this->module->allocator->pool,(CodeLocation *)(lVar9 + 0x10),
                             (Property *)(lVar9 + 0x2c));
        return &pPVar20->super_Expression;
      }
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,
                 "Processor properties are only valid inside a processor declaration");
      AST::Context::throwError((Context *)(lVar9 + 0x10),&local_a0,false);
    }
  }
  pEVar12 = getExpressionAsConstLocalCopy(this,e);
  return pEVar12;
}

Assistant:

heart::Expression& evaluateAsExpression (AST::Expression& e)
    {
        if (++expressionDepth < maxExpressionDepth)
        {
            if (auto c = e.getAsConstant())
                return module.allocator.allocate<heart::Constant> (c->context.location, c->value);

            if (auto v = cast<AST::VariableRef> (e))
            {
                if (v->variable->isAssignable())
                    if (v->variable->getParentScope()->findModule() != e.getParentScope()->findModule())
                        v->context.throwError (Errors::cannotReferenceOtherProcessorVar());

                if (auto a = v->variable->generatedVariable)
                    return *a;

                if (auto initial = v->variable->initialValue)
                    return evaluateAsExpression (*initial);

                return builder.createZeroInitialiser (v->getResultType());
            }

            if (auto member = cast<AST::StructMemberRef> (e))
            {
                auto structType = getStructType (*member);

                auto& source = evaluateAsExpression (member->object, structType);
                return createStructSubElement (*member, source);
            }

            if (auto subscript = cast<AST::ArrayElementRef> (e))
            {
                auto arrayOrVectorType = getArrayOrVectorType (*subscript);
                auto& source = evaluateAsExpression (*subscript->object, arrayOrVectorType);
                return createArraySubElement (*subscript, source);
            }

            if (auto c = cast<AST::TypeCast> (e))
            {
                SOUL_ASSERT (c->getNumArguments() != 0);

                pool_ref<AST::Expression> source = c->source;

                if (auto list = cast<AST::CommaSeparatedList> (c->source))
                {
                    if (list->items.size() != 1)
                        return createAggregateWithInitialisers (*c);

                    source = list->items.front();
                }

                auto& sourceExp = evaluateAsExpression (source);
                const auto& sourceType = sourceExp.getType();

                if (TypeRules::canCastTo (c->targetType, sourceType))
                    return builder.createCastIfNeeded (sourceExp, c->targetType);

                if (c->targetType.isFixedSizeAggregate() && c->targetType.getNumAggregateElements() == 1)
                    return createAggregateWithInitialisers (*c);

                SanityCheckPass::expectCastPossible (c->source->context, c->targetType, sourceType);
            }

            if (auto op = cast<AST::BinaryOperator> (e))
            {
                auto operandType = op->getOperandType();

                // (putting these into locals to make sure we evaluate everything in left-to-right order)
                auto& lhs = builder.createCastIfNeeded (evaluateAsExpression (op->lhs), operandType);
                auto& rhs = builder.createCastIfNeeded (evaluateAsExpression (op->rhs), operandType);

                return builder.createCastIfNeeded (builder.createBinaryOp (op->context.location, lhs, rhs, op->operation),
                                                   op->getResultType());
            }

            if (auto op = cast<AST::UnaryOperator> (e))
            {
                auto sourceType = op->getResultType();
                auto& source = builder.createCastIfNeeded (evaluateAsExpression (op->source), sourceType);
                return builder.createUnaryOp (op->context.location, source, op->operation);
            }

            if (auto pp = cast<AST::ProcessorProperty> (e))
            {
                if (module.isNamespace())
                    pp->context.throwError (Errors::processorPropertyUsedOutsideDecl());

                return module.allocator.allocate<heart::ProcessorProperty> (pp->context.location, pp->property);
            }
        }

        return getExpressionAsConstLocalCopy (e);
    }